

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O1

int npf_parse_format_spec(char *format,npf_format_spec_t *out_spec)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint8_t uVar7;
  char *cur;
  
  out_spec->left_justified = '\0';
  out_spec->leading_zero_pad = '\0';
  out_spec->case_adjust = ' ';
  out_spec->prepend = '\0';
  out_spec->alt_form = '\0';
  pbVar4 = (byte *)(format + 1);
  do {
    bVar2 = *pbVar4;
    if (bVar2 < 0x2b) {
      if (bVar2 == 0x20) {
        if (out_spec->prepend == '\0') {
          out_spec->prepend = ' ';
        }
      }
      else {
        if (bVar2 != 0x23) goto LAB_0010bcab;
        out_spec->alt_form = '#';
      }
    }
    else if (bVar2 == 0x2b) {
      out_spec->prepend = '+';
    }
    else if (bVar2 == 0x30) {
      out_spec->leading_zero_pad = out_spec->left_justified == '\0';
    }
    else {
      if (bVar2 != 0x2d) goto LAB_0010bcab;
      out_spec->left_justified = '-';
      out_spec->leading_zero_pad = '\0';
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
switchD_0010bdf9_caseD_61:
  out_spec->conv_spec = '\x0e';
  goto LAB_0010bea9;
LAB_0010bcab:
  out_spec->field_width = 0;
  out_spec->field_width_opt = '\0';
  if (*pbVar4 == 0x2a) {
    out_spec->field_width_opt = '\x02';
    pbVar4 = pbVar4 + 1;
  }
  else if ((byte)(*pbVar4 - 0x30) < 10) {
    iVar3 = out_spec->field_width;
    pbVar5 = pbVar4;
    do {
      out_spec->field_width_opt = '\x01';
      pbVar4 = pbVar5 + 1;
      iVar3 = (int)(char)*pbVar5 + iVar3 * 10 + -0x30;
      out_spec->field_width = iVar3;
      pbVar6 = pbVar5 + 1;
      pbVar5 = pbVar4;
    } while ((byte)(*pbVar6 - 0x30) < 10);
  }
  out_spec->prec = 0;
  out_spec->prec_opt = '\0';
  if (*pbVar4 == 0x2e) {
    if (pbVar4[1] == 0x2d) {
      pbVar4 = pbVar4 + 2;
    }
    else {
      if (pbVar4[1] == 0x2a) {
        out_spec->prec_opt = '\x02';
        pbVar4 = pbVar4 + 2;
        goto LAB_0010bd5c;
      }
      pbVar4 = pbVar4 + 1;
      out_spec->prec_opt = '\x01';
    }
    bVar2 = *pbVar4;
    if ((byte)(bVar2 - 0x30) < 10) {
      iVar3 = out_spec->prec;
      do {
        iVar3 = (uint)(byte)(bVar2 - 0x30) + iVar3 * 10;
        out_spec->prec = iVar3;
        bVar2 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
  }
LAB_0010bd5c:
  out_spec->length_modifier = '\0';
  pbVar5 = pbVar4 + 1;
  bVar2 = *pbVar4;
  pbVar6 = pbVar5;
  if (bVar2 < 0x6c) {
    if (bVar2 == 0x4c) {
      out_spec->length_modifier = '\x02';
    }
    else if (bVar2 == 0x68) {
      out_spec->length_modifier = '\x01';
      if (*pbVar5 == 0x68) {
        out_spec->length_modifier = '\x03';
        goto LAB_0010bdcc;
      }
    }
    else {
      pbVar6 = pbVar4;
      if (bVar2 == 0x6a) {
        out_spec->length_modifier = '\x06';
        pbVar6 = pbVar5;
      }
    }
  }
  else if (bVar2 == 0x6c) {
    out_spec->length_modifier = '\x04';
    if (*pbVar5 == 0x6c) {
      out_spec->length_modifier = '\x05';
LAB_0010bdcc:
      pbVar6 = pbVar4 + 2;
    }
  }
  else if (bVar2 == 0x74) {
    out_spec->length_modifier = '\b';
  }
  else {
    pbVar6 = pbVar4;
    if (bVar2 == 0x7a) {
      out_spec->length_modifier = '\a';
      pbVar6 = pbVar5;
    }
  }
  bVar2 = *pbVar6;
  iVar3 = 0;
  switch(bVar2) {
  case 0x58:
    bVar1 = true;
    goto LAB_0010be5f;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_0010bdf9_caseD_59;
  case 0x61:
    goto switchD_0010bdf9_caseD_61;
  case 0x62:
switchD_0010bdf9_caseD_62:
    out_spec->conv_spec = '\x05';
    goto LAB_0010beb6;
  case 99:
    out_spec->conv_spec = '\x02';
    goto LAB_0010be55;
  case 100:
  case 0x69:
    iVar3 = 4;
    goto LAB_0010be5d;
  case 0x65:
switchD_0010bdf9_caseD_65:
    out_spec->conv_spec = '\f';
    break;
  case 0x66:
switchD_0010bdf9_caseD_66:
    out_spec->conv_spec = '\v';
    break;
  case 0x67:
switchD_0010bdf9_caseD_67:
    out_spec->conv_spec = '\r';
    break;
  case 0x6e:
    out_spec->conv_spec = '\n';
    goto LAB_0010be55;
  case 0x6f:
    iVar3 = 6;
    goto LAB_0010be5d;
  case 0x70:
    out_spec->conv_spec = '\t';
LAB_0010be55:
    out_spec->prec_opt = '\0';
    goto LAB_0010beb6;
  case 0x73:
    out_spec->conv_spec = '\x03';
    goto LAB_0010be7d;
  case 0x75:
    iVar3 = 8;
LAB_0010be5d:
    bVar1 = false;
LAB_0010be5f:
    if (bVar1) {
      out_spec->case_adjust = '\0';
    }
switchD_0010bdf9_caseD_78:
    uVar7 = '\a';
    if ((uint8_t)iVar3 != '\0') {
      uVar7 = (uint8_t)iVar3;
    }
    out_spec->conv_spec = uVar7;
    if (out_spec->prec_opt != '\0') {
LAB_0010be7d:
      out_spec->leading_zero_pad = '\0';
    }
    goto LAB_0010beb6;
  case 0x78:
    goto switchD_0010bdf9_caseD_78;
  default:
    iVar3 = 0;
    switch(bVar2) {
    case 0x41:
      out_spec->case_adjust = '\0';
      break;
    case 0x42:
      out_spec->case_adjust = '\0';
      goto switchD_0010bdf9_caseD_62;
    case 0x43:
    case 0x44:
      goto switchD_0010bdf9_caseD_59;
    case 0x45:
      out_spec->case_adjust = '\0';
      goto switchD_0010bdf9_caseD_65;
    case 0x46:
      out_spec->case_adjust = '\0';
      goto switchD_0010bdf9_caseD_66;
    case 0x47:
      out_spec->case_adjust = '\0';
      goto switchD_0010bdf9_caseD_67;
    default:
      if (bVar2 != 0x25) {
        return 0;
      }
      out_spec->conv_spec = '\x01';
      goto LAB_0010be55;
    }
    goto switchD_0010bdf9_caseD_61;
  }
LAB_0010bea9:
  if (out_spec->prec_opt == '\0') {
    out_spec->prec = 6;
  }
LAB_0010beb6:
  iVar3 = ((int)pbVar6 + 1) - (int)format;
switchD_0010bdf9_caseD_59:
  return iVar3;
}

Assistant:

static int npf_parse_format_spec(char const *format, npf_format_spec_t *out_spec) {
  char const *cur = format;

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->left_justified = 0;
  out_spec->leading_zero_pad = 0;
#endif
  out_spec->case_adjust = 'a' - 'A'; // lowercase
  out_spec->prepend = 0;
  out_spec->alt_form = 0;

  while (*++cur) { // cur points at the leading '%' character
    switch (*cur) { // Optional flags
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      case '-': out_spec->left_justified = '-'; out_spec->leading_zero_pad = 0; continue;
      case '0': out_spec->leading_zero_pad = !out_spec->left_justified; continue;
#endif
      case '+': out_spec->prepend = '+'; continue;
      case ' ': if (out_spec->prepend == 0) { out_spec->prepend = ' '; } continue;
      case '#': out_spec->alt_form = '#'; continue;
      default: break;
    }
    break;
  }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->field_width = 0;
  out_spec->field_width_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '*') {
    out_spec->field_width_opt = NPF_FMT_SPEC_OPT_STAR;
    ++cur;
  } else {
    while ((*cur >= '0') && (*cur <= '9')) {
      out_spec->field_width_opt = NPF_FMT_SPEC_OPT_LITERAL;
      out_spec->field_width = (out_spec->field_width * 10) + (*cur++ - '0');
    }
  }
#endif

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
  out_spec->prec = 0;
  out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '.') {
    ++cur;
    if (*cur == '*') {
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_STAR;
      ++cur;
    } else {
      if (*cur == '-') {
        ++cur;
      } else {
        out_spec->prec_opt = NPF_FMT_SPEC_OPT_LITERAL;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        out_spec->prec = (out_spec->prec * 10) + (*cur++ - '0');
      }
    }
  }
#endif

  uint_fast8_t tmp_conv = NPF_FMT_SPEC_CONV_NONE;
  out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_NONE;
  switch (*cur++) { // Length modifier
    case 'h':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_SHORT;
      if (*cur == 'h') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_CHAR;
        ++cur;
      }
      break;
    case 'l':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG;
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
      if (*cur == 'l') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_LONG_LONG;
        ++cur;
      }
#endif
      break;
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'L': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE; break;
#endif
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
    case 'j': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_INTMAX; break;
    case 'z': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_SIZET; break;
    case 't': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_PTRDIFFT; break;
#endif
    default: --cur; break;
  }

  switch (*cur++) { // Conversion specifier
    case '%': out_spec->conv_spec = NPF_FMT_SPEC_CONV_PERCENT;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 'c': out_spec->conv_spec = NPF_FMT_SPEC_CONV_CHAR;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 's': out_spec->conv_spec = NPF_FMT_SPEC_CONV_STRING;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      out_spec->leading_zero_pad = 0;
#endif
      break;

    case 'i':
    case 'd': tmp_conv = NPF_FMT_SPEC_CONV_SIGNED_INT;
    case 'o':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_OCTAL; }
    case 'u':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_UNSIGNED_INT; }
    case 'X':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { out_spec->case_adjust = 0; }
    case 'x':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_HEX_INT; }
      out_spec->conv_spec = (uint8_t)tmp_conv;
#if (NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1) && \
    (NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1)
      if (out_spec->prec_opt != NPF_FMT_SPEC_OPT_NONE) { out_spec->leading_zero_pad = 0; }
#endif
      break;

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'F': out_spec->case_adjust = 0;
    case 'f':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_DEC;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'E': out_spec->case_adjust = 0;
    case 'e':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SCI;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'G': out_spec->case_adjust = 0;
    case 'g':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SHORTEST;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'A': out_spec->case_adjust = 0;
    case 'a':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_HEX;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;
#endif

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
    case 'n':
      // todo: reject string if flags or width or precision exist
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_WRITEBACK;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;
#endif

    case 'p':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_POINTER;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
    case 'B':
      out_spec->case_adjust = 0;
    case 'b':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_BINARY;
      break;
#endif

    default: return 0;
  }

  return (int)(cur - format);
}